

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float *pfVar11;
  ImFontGlyph *pIVar12;
  ImFontGlyph *pIVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  
  uVar15 = (ulong)(uint)(this->Glyphs).Size;
  if (uVar15 == 0) {
    uVar17 = 1;
  }
  else {
    lVar14 = 0;
    uVar17 = 0;
    do {
      uVar16 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar14) >> 2;
      if (uVar16 < uVar17) {
        uVar16 = uVar17;
      }
      uVar17 = uVar16;
      lVar14 = lVar14 + 0x28;
    } while (uVar15 * 0x28 != lVar14);
    uVar17 = uVar17 + 1;
  }
  pfVar3 = (this->IndexAdvanceX).Data;
  if (pfVar3 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar3);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar4 = (this->IndexLookup).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar4);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar17);
  iVar2 = (this->Glyphs).Size;
  lVar14 = (long)iVar2;
  if (0 < lVar14) {
    pfVar3 = (this->IndexAdvanceX).Data;
    puVar4 = (this->IndexLookup).Data;
    pfVar11 = &((this->Glyphs).Data)->AdvanceX;
    lVar18 = 0;
    do {
      uVar16 = *(uint *)(pfVar11 + -1);
      *(float *)((long)pfVar3 + (ulong)(uVar16 & 0xfffffffc)) = *pfVar11;
      puVar4[uVar16 >> 2] = (unsigned_short)lVar18;
      this->Used4kPagesMap[uVar16 >> 0x11] =
           this->Used4kPagesMap[uVar16 >> 0x11] | (byte)(1 << ((byte)(uVar16 >> 0xe) & 7));
      lVar18 = lVar18 + 1;
      pfVar11 = pfVar11 + 10;
    } while (lVar14 != lVar18);
  }
  uVar16 = (this->IndexLookup).Size;
  if ((uVar16 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    pIVar12 = (this->Glyphs).Data;
    if (((undefined1  [40])pIVar12[lVar14 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      iVar20 = iVar2 + 1;
      iVar19 = (this->Glyphs).Capacity;
      if (iVar19 <= iVar2) {
        if (iVar19 == 0) {
          iVar19 = 8;
        }
        else {
          iVar19 = iVar19 / 2 + iVar19;
        }
        if (iVar19 <= iVar20) {
          iVar19 = iVar20;
        }
        pIVar12 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar19 * 0x28);
        pIVar13 = (this->Glyphs).Data;
        if (pIVar13 != (ImFontGlyph *)0x0) {
          memcpy(pIVar12,pIVar13,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar12;
        (this->Glyphs).Capacity = iVar19;
        uVar16 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = iVar20;
      lVar14 = (long)iVar20;
    }
    if ((uVar16 < 0x21) || (uVar15 = (ulong)(this->IndexLookup).Data[0x20], uVar15 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = pIVar12 + uVar15;
    }
    fVar21 = pIVar13->V1;
    pIVar12[lVar14 + -1].U1 = pIVar13->U1;
    pIVar12[lVar14 + -1].V1 = fVar21;
    uVar7 = *(undefined4 *)&pIVar13->field_0x0;
    fVar8 = pIVar13->AdvanceX;
    fVar9 = pIVar13->X0;
    fVar10 = pIVar13->Y0;
    fVar21 = pIVar13->Y1;
    fVar5 = pIVar13->U0;
    fVar6 = pIVar13->V0;
    pIVar12[lVar14 + -1].X1 = pIVar13->X1;
    pIVar12[lVar14 + -1].Y1 = fVar21;
    pIVar12[lVar14 + -1].U0 = fVar5;
    pIVar12[lVar14 + -1].V0 = fVar6;
    *(undefined4 *)&pIVar12[lVar14 + -1].field_0x0 = uVar7;
    pIVar12[lVar14 + -1].AdvanceX = fVar8;
    pIVar12[lVar14 + -1].X0 = fVar9;
    pIVar12[lVar14 + -1].Y0 = fVar10;
    *(uint *)(pIVar12 + lVar14 + -1) = *(uint *)(pIVar12 + lVar14 + -1) & 3 | 0x24;
    fVar21 = pIVar12[lVar14 + -1].AdvanceX * 4.0;
    pIVar12[lVar14 + -1].AdvanceX = fVar21;
    (this->IndexAdvanceX).Data[9] = fVar21;
    (this->IndexLookup).Data[*(uint *)(pIVar12 + lVar14 + -1) >> 2] = (short)(this->Glyphs).Size - 1
    ;
    uVar16 = (this->IndexLookup).Size;
  }
  if ((uVar16 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
    uVar16 = (this->IndexLookup).Size;
  }
  if ((uVar16 < 10) || (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar12 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
    uVar16 = (this->IndexLookup).Size;
  }
  if (((ulong)this->FallbackChar < (ulong)(long)(int)uVar16) &&
     (uVar15 = (ulong)(this->IndexLookup).Data[this->FallbackChar], uVar15 != 0xffff)) {
    pIVar13 = (this->Glyphs).Data;
    pIVar12 = pIVar13 + uVar15;
    this->FallbackGlyph = pIVar12;
    if (pIVar13 != (ImFontGlyph *)0x0) {
      fVar21 = pIVar12->AdvanceX;
      goto LAB_0013ad2e;
    }
  }
  else {
    this->FallbackGlyph = (ImFontGlyph *)0x0;
  }
  fVar21 = 0.0;
LAB_0013ad2e:
  this->FallbackAdvanceX = fVar21;
  pfVar3 = (this->IndexAdvanceX).Data;
  uVar15 = 0;
  do {
    pfVar11 = pfVar3 + uVar15;
    if (*pfVar11 <= 0.0 && *pfVar11 != 0.0) {
      pfVar3[uVar15] = fVar21;
    }
    uVar15 = uVar15 + 1;
  } while (uVar17 != uVar15);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}